

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_rotatePoint(double *x,double *y)

{
  double dVar1;
  double dVar2;
  DAngle local_18;
  
  dVar2 = m_w * 0.5 + m_x;
  dVar1 = m_h * 0.5 + m_y;
  *x = *x - dVar2;
  *y = *y - dVar1;
  local_18.Degrees = 90.0 - *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0xb0);
  AM_rotate(x,y,&local_18);
  *x = dVar2 + *x;
  *y = dVar1 + *y;
  return;
}

Assistant:

void AM_rotatePoint (double *x, double *y)
{
	double pivotx = m_x + m_w/2;
	double pivoty = m_y + m_h/2;
	*x -= pivotx;
	*y -= pivoty;
	AM_rotate (x, y, -players[consoleplayer].camera->Angles.Yaw + 90.);
	*x += pivotx;
	*y += pivoty;
}